

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sketch_impl.h
# Opt level: O1

void PolyMod<(anonymous_namespace)::Field<unsigned_int,32,141u,RecLinTrans<unsigned_int,6,6,5,5,5,5>,RecLinTrans<unsigned_int,4,4,4,4,4,4,4,4>,&(anonymous_namespace)::SQR_TABLE_32,&(anonymous_namespace)::QRT_TABLE_32>>
               (vector<unsigned_int,_std::allocator<unsigned_int>_> *mod,
               vector<unsigned_int,_std::allocator<unsigned_int>_> *val,
               Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
               *field)

{
  uint *puVar1;
  uint uVar2;
  pointer puVar3;
  pointer puVar4;
  pointer puVar5;
  long lVar6;
  ulong uVar7;
  long lVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  Multiplier mul;
  Multiplier local_238;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  uVar9 = (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                super__Vector_impl_data._M_start;
  if (uVar9 <= (ulong)((long)(val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                             _M_impl.super__Vector_impl_data._M_finish -
                      (long)(val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                            _M_impl.super__Vector_impl_data._M_start)) {
    puVar4 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    uVar7 = (long)puVar5 - (long)puVar4;
    if (uVar9 <= uVar7) {
      do {
        uVar2 = puVar5[-1];
        (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
        super__Vector_impl_data._M_finish = puVar5 + -1;
        if (uVar2 != 0) {
          anon_unknown.dwarf_418a755::
          Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
          ::Multiplier::Multiplier
                    (&local_238,
                     (Field<unsigned_int,_32,_141U,_RecLinTrans<unsigned_int,_6,_6,_5,_5,_5,_5>,_RecLinTrans<unsigned_int,_4,_4,_4,_4,_4,_4,_4,_4>,_&(anonymous_namespace)::SQR_TABLE_32,_&(anonymous_namespace)::QRT_TABLE_32>
                      *)(ulong)uVar2,(Elem)uVar7);
          puVar4 = (mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          lVar6 = (long)(mod->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                        _M_impl.super__Vector_impl_data._M_finish - (long)puVar4 >> 2;
          if (lVar6 != 1) {
            puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            puVar3 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
            lVar8 = 0;
            do {
              uVar2 = puVar4[lVar8];
              puVar1 = puVar5 + (((ulong)((long)puVar3 - (long)puVar5) >> 2) - ((long)uVar9 >> 2)) +
                                lVar8 + 1;
              *puVar1 = *puVar1 ^ *(uint *)((long)local_238.table.rec.trans.table +
                                           (ulong)(uVar2 >> 2 & 0x3c)) ^
                                  local_238.table.trans.table[uVar2 & 0xf] ^
                                  *(uint *)((long)local_238.table.rec.rec.trans.table +
                                           (ulong)(uVar2 >> 6 & 0x3c)) ^
                                  *(uint *)((long)&local_238.table.rec.rec.rec.trans +
                                           (ulong)(uVar2 >> 10 & 0x3c)) ^
                                  *(uint *)((long)&local_238.table.rec.rec.rec.rec +
                                           (ulong)(uVar2 >> 0xe & 0x3c)) ^
                                  *(uint *)((long)&local_238.table.rec.rec.rec.rec +
                                           (ulong)(uVar2 >> 0x12 & 0x3c) + 0x40) ^
                                  *(uint *)((long)&local_238.table.rec.rec.rec.rec +
                                           (ulong)(uVar2 >> 0x16 & 0x3c) + 0x80) ^
                                  *(uint *)((long)&local_238.table.rec.rec.rec.rec +
                                           (ulong)(uVar2 >> 0x1c) * 4 + 0xc0);
              lVar8 = lVar8 + 1;
            } while (lVar6 + -1 != lVar8);
          }
        }
        puVar4 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
                 super__Vector_impl_data._M_finish;
        uVar7 = (long)puVar5 - (long)puVar4;
      } while (uVar9 <= uVar7);
    }
    puVar5 = (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    while ((puVar5 != puVar4 && (puVar5 = puVar5 + -1, *puVar5 == 0))) {
      (val->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar5;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PolyMod(const std::vector<typename F::Elem>& mod, std::vector<typename F::Elem>& val, const F& field) {
    size_t modsize = mod.size();
    CHECK_SAFE(modsize > 0 && mod.back() == 1);
    if (val.size() < modsize) return;
    CHECK_SAFE(val.back() != 0);
    while (val.size() >= modsize) {
        auto term = val.back();
        val.pop_back();
        if (term != 0) {
            typename F::Multiplier mul(field, term);
            for (size_t x = 0; x < mod.size() - 1; ++x) {
                val[val.size() - modsize + 1 + x] ^= mul(mod[x]);
            }
        }
    }
    while (val.size() > 0 && val.back() == 0) val.pop_back();
}